

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Erase(ShardedLRUCache *this,Slice *key)

{
  long lVar1;
  Slice *in_RSI;
  undefined8 in_RDI;
  uint32_t hash_00;
  long in_FS_OFFSET;
  uint32_t unaff_retaddr;
  Slice *in_stack_00000008;
  uint32_t hash;
  
  hash_00 = (uint32_t)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  HashSlice(in_RSI);
  Shard(hash_00);
  LRUCache::Erase((LRUCache *)key,in_stack_00000008,unaff_retaddr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Erase(const Slice& key) override {
    const uint32_t hash = HashSlice(key);
    shard_[Shard(hash)].Erase(key, hash);
  }